

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lad.cc
# Opt level: O1

InputGraph __thiscall
anon_unknown.dwarf_24942a::read_any_lad
          (anon_unknown_dwarf_24942a *this,ifstream *infile,string *filename,bool directed,
          bool vertex_labels,bool edge_labels)

{
  bool bVar1;
  int b;
  _Alloc_hider _Var2;
  _Head_base<0UL,_InputGraph::Imp_*,_false> _Var3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  istream *piVar8;
  void *pvVar9;
  int *piVar10;
  long lVar11;
  GraphFileError *pGVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined7 in_register_00000009;
  ulong uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  uint uVar16;
  uint uVar17;
  size_type __n;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  uint __val;
  int iVar18;
  string_view l;
  string_view l_00;
  string_view l_01;
  string_view label;
  string rest;
  string before;
  string after;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  _Head_base<0UL,_InputGraph::Imp_*,_false> local_a0;
  string *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  istream *local_70;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38;
  
  local_5c = CONCAT31(in_register_00000089,edge_labels);
  local_60 = (undefined4)CONCAT71(in_register_00000009,directed);
  local_64 = (undefined4)CONCAT71(in_register_00000081,vertex_labels);
  local_98 = filename;
  InputGraph::InputGraph((InputGraph *)this,0,vertex_labels,edge_labels);
  std::istream::operator>>(infile,(int *)&local_c0);
  InputGraph::resize((InputGraph *)this,(uint)local_c0._M_dataplus._M_p);
  local_a0._M_head_impl = (Imp *)this;
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
    pGVar12 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"error reading size","");
    GraphFileError::GraphFileError(pGVar12,local_98,&local_c0,true);
    __cxa_throw(pGVar12,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  local_70 = (istream *)infile;
  for (__val = 0; iVar4 = InputGraph::size((InputGraph *)this), (int)__val < iVar4;
      __val = __val + 1) {
    uVar16 = 1;
    if (9 < __val) {
      uVar14 = (ulong)__val;
      uVar17 = 4;
      do {
        uVar16 = uVar17;
        uVar5 = (uint)uVar14;
        if (uVar5 < 100) {
          uVar16 = uVar16 - 2;
          goto LAB_0013f667;
        }
        if (uVar5 < 1000) {
          uVar16 = uVar16 - 1;
          goto LAB_0013f667;
        }
        if (uVar5 < 10000) goto LAB_0013f667;
        uVar14 = uVar14 / 10000;
        uVar17 = uVar16 + 4;
      } while (99999 < uVar5);
      uVar16 = uVar16 + 1;
    }
LAB_0013f667:
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_c0,(ulong)uVar16,'-');
    std::__detail::__to_chars_10_impl<unsigned_int>(local_c0._M_dataplus._M_p,uVar16,__val);
    l._M_str = local_c0._M_dataplus._M_p;
    l._M_len = local_c0._M_string_length;
    InputGraph::set_vertex_name((InputGraph *)this,__val,l);
    infile = (ifstream *)local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if ((char)local_64 != '\0') {
      std::istream::operator>>(infile,(int *)&local_c0);
      if (((byte)((istream *)infile)[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0)
      goto LAB_0013fc62;
      uVar16 = -(uint)local_c0._M_dataplus._M_p;
      if (0 < (int)(uint)local_c0._M_dataplus._M_p) {
        uVar16 = (uint)local_c0._M_dataplus._M_p;
      }
      uVar17 = 1;
      if (9 < uVar16) {
        uVar14 = (ulong)uVar16;
        uVar5 = 4;
        do {
          uVar17 = uVar5;
          uVar6 = (uint)uVar14;
          if (uVar6 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_0013f74d;
          }
          if (uVar6 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_0013f74d;
          }
          if (uVar6 < 10000) goto LAB_0013f74d;
          uVar14 = uVar14 / 10000;
          uVar5 = uVar17 + 4;
        } while (99999 < uVar6);
        uVar17 = uVar17 + 1;
      }
LAB_0013f74d:
      iVar4 = (int)(uint)local_c0._M_dataplus._M_p >> 0x1f;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_c0,(ulong)(uVar17 + -iVar4),'-');
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_c0._M_dataplus._M_p + (uint)-iVar4,uVar17,uVar16);
      l_00._M_str = local_c0._M_dataplus._M_p;
      l_00._M_len = local_c0._M_string_length;
      InputGraph::set_vertex_label((InputGraph *)this,__val,l_00);
      infile = (ifstream *)local_70;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
    }
    std::istream::operator>>(infile,(int *)&local_c0);
    if (((byte)((istream *)infile)[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
      pGVar12 = (GraphFileError *)__cxa_allocate_exception(0x30);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"error reading edges count","");
      GraphFileError::GraphFileError(pGVar12,local_98,&local_c0,true);
      __cxa_throw(pGVar12,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    iVar4 = (uint)local_c0._M_dataplus._M_p;
    if (0 < (int)(uint)local_c0._M_dataplus._M_p) {
      iVar18 = 0;
      do {
        std::istream::operator>>(infile,(int *)&local_c0);
        b = (uint)local_c0._M_dataplus._M_p;
        if (((int)(uint)local_c0._M_dataplus._M_p < 0) ||
           (iVar7 = InputGraph::size((InputGraph *)this), iVar7 <= b)) {
          pGVar12 = (GraphFileError *)__cxa_allocate_exception(0x30);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c0,"edge index out of bounds","");
          GraphFileError::GraphFileError(pGVar12,local_98,&local_c0,true);
          __cxa_throw(pGVar12,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
        }
        if ((char)local_5c == '\0') {
          if ((char)local_60 == '\0') {
            InputGraph::add_edge((InputGraph *)this,__val,b);
          }
          else {
            InputGraph::add_directed_edge
                      ((InputGraph *)this,__val,b,(string_view)(ZEXT816(0x14334a) << 0x40));
          }
        }
        else {
          std::istream::operator>>(infile,(int *)&local_c0);
          uVar16 = (uint)local_c0._M_dataplus._M_p;
          if ((int)(uint)local_c0._M_dataplus._M_p < 0) {
            pGVar12 = (GraphFileError *)__cxa_allocate_exception(0x30);
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,"edge label invalid","");
            GraphFileError::GraphFileError(pGVar12,local_98,&local_c0,true);
            __cxa_throw(pGVar12,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
          }
          uVar17 = 1;
          if (9 < (uint)local_c0._M_dataplus._M_p) {
            uVar5 = 4;
            do {
              uVar17 = uVar5;
              if ((uint)local_c0._M_dataplus._M_p < 100) {
                uVar17 = uVar17 - 2;
                goto LAB_0013f8ad;
              }
              if ((uint)local_c0._M_dataplus._M_p < 1000) {
                uVar17 = uVar17 - 1;
                goto LAB_0013f8ad;
              }
              if ((uint)local_c0._M_dataplus._M_p < 10000) goto LAB_0013f8ad;
              bVar1 = 99999 < (uint)local_c0._M_dataplus._M_p;
              local_c0._M_dataplus._M_p._0_4_ = (uint)local_c0._M_dataplus._M_p / 10000;
              uVar5 = uVar17 + 4;
            } while (bVar1);
            uVar17 = uVar17 + 1;
          }
LAB_0013f8ad:
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_c0,(ulong)uVar17,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(local_c0._M_dataplus._M_p,uVar17,uVar16);
          this = (anon_unknown_dwarf_24942a *)local_a0;
          label._M_str = local_c0._M_dataplus._M_p;
          label._M_len = local_c0._M_string_length;
          InputGraph::add_directed_edge((InputGraph *)local_a0._M_head_impl,__val,b,label);
          infile = (ifstream *)local_70;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,
                            CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                     local_c0.field_2._M_local_buf[0]) + 1);
            infile = (ifstream *)local_70;
          }
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 != iVar4);
    }
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  do {
    piVar8 = std::operator>>((istream *)infile,(string *)&local_c0);
    _Var3._M_head_impl = local_a0._M_head_impl;
    _Var2._M_p = local_c0._M_dataplus._M_p;
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
      if (((byte)((istream *)infile)[*(long *)(*(long *)infile + -0x18) + 0x20] & 2) == 0) {
        pGVar12 = (GraphFileError *)__cxa_allocate_exception(0x30);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"EOF not reached","");
        GraphFileError::GraphFileError(pGVar12,local_98,&local_90,true);
        __cxa_throw(pGVar12,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
             (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)_Var3._M_head_impl;
    }
    if (local_c0._M_string_length == 0) {
      __n = 0xffffffffffffffff;
    }
    else {
      pvVar9 = memchr(local_c0._M_dataplus._M_p,0x3d,local_c0._M_string_length);
      __n = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)_Var2._M_p;
    }
    if (__n == 0xffffffffffffffff) {
LAB_0013fbfa:
      pGVar12 = (GraphFileError *)__cxa_allocate_exception(0x30);
      std::operator+(&local_58,"EOF not reached, next text is \"",&local_c0);
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_58,"\"");
      local_90._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == paVar15) {
        local_90.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_90._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      GraphFileError::GraphFileError(pGVar12,local_98,&local_90,true);
      __cxa_throw(pGVar12,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_90,&local_c0,0,__n);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_58,&local_c0,__n + 1,0xffffffffffffffff);
    _Var2._M_p = local_90._M_dataplus._M_p;
    piVar10 = __errno_location();
    iVar4 = *piVar10;
    *piVar10 = 0;
    lVar11 = strtol(_Var2._M_p,&local_38,10);
    if (local_38 == _Var2._M_p) {
      std::__throw_invalid_argument("stoi");
LAB_0013fc62:
      pGVar12 = (GraphFileError *)__cxa_allocate_exception(0x30);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"error reading label","");
      GraphFileError::GraphFileError(pGVar12,local_98,&local_c0,true);
      __cxa_throw(pGVar12,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    if (((int)lVar11 != lVar11) || (*piVar10 == 0x22)) {
      std::__throw_out_of_range("stoi");
      goto LAB_0013fbfa;
    }
    if (*piVar10 == 0) {
      *piVar10 = iVar4;
    }
    l_01._M_str = local_58._M_dataplus._M_p;
    l_01._M_len = local_58._M_string_length;
    InputGraph::set_vertex_name((InputGraph *)local_a0._M_head_impl,(int)lVar11,l_01);
    infile = (ifstream *)local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

auto read_any_lad(ifstream && infile, const string & filename,
        bool directed,
        bool vertex_labels,
        bool edge_labels) -> InputGraph
    {
        InputGraph result{0, vertex_labels, edge_labels};

        result.resize(read_word(infile));
        if (! infile)
            throw GraphFileError{filename, "error reading size", true};

        for (int r = 0; r < result.size(); ++r) {
            result.set_vertex_name(r, to_string(r));

            if (vertex_labels) {
                int l = read_word(infile);
                if (! infile)
                    throw GraphFileError{filename, "error reading label", true};

                result.set_vertex_label(r, to_string(l));
            }

            int c_end = read_word(infile);
            if (! infile)
                throw GraphFileError{filename, "error reading edges count", true};

            for (int c = 0; c < c_end; ++c) {
                int e = read_word(infile);

                if (e < 0 || e >= result.size())
                    throw GraphFileError{filename, "edge index out of bounds", true};

                if (edge_labels) {
                    int l = read_word(infile);
                    if (l < 0)
                        throw GraphFileError{filename, "edge label invalid", true};

                    result.add_directed_edge(r, e, to_string(l));
                }
                else if (directed)
                    result.add_directed_edge(r, e, "");
                else
                    result.add_edge(r, e);
            }
        }

        string rest;
        while (infile >> rest) {
            auto equals_pos = rest.find('=');
            if (string::npos == equals_pos)
                throw GraphFileError{filename, "EOF not reached, next text is \"" + rest + "\"", true};
            else {
                string before = rest.substr(0, equals_pos), after = rest.substr(equals_pos + 1);
                result.set_vertex_name(stoi(before), after);
            }
        }
        if (! infile.eof())
            throw GraphFileError{filename, "EOF not reached", true};

        return result;
    }